

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O1

bool hwl::cmd_str(state *ps,string *psVal)

{
  bool bVar1;
  combinator *in_R8;
  undefined8 *puVar2;
  long lVar3;
  _Any_data _Stack_138;
  code *local_128;
  code *local_120;
  code **local_118;
  undefined8 uStack_110;
  code *local_108;
  code *pcStack_100;
  code **local_f8;
  undefined8 uStack_f0;
  code *local_e8;
  code *pcStack_e0;
  undefined8 local_d8;
  code ***pppcStack_d0;
  code *local_c8;
  code *pcStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68 [2];
  code ***local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28 [2];
  
  local_118 = &local_98;
  uStack_90 = 0;
  local_98 = nl;
  pcStack_80 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_88 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  uStack_70 = 0;
  local_78 = 0x23;
  local_68[1] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
                ::_M_invoke;
  local_68[0] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:593:10)>
                ::_M_manager;
  local_58 = &local_118;
  uStack_110 = 2;
  pcStack_100 = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
              ::_M_manager;
  local_f8 = local_68 + 2;
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_manager;
  local_38 = 0;
  uStack_30 = 0;
  local_28[1] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:628:10)>
                ::_M_invoke;
  local_28[0] = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:628:10)>
                ::_M_manager;
  pppcStack_d0 = &local_f8;
  uStack_f0 = 2;
  pcStack_e0 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
             ::_M_manager;
  local_b8._8_8_ = &local_d8;
  local_d8 = 4;
  pcStack_c0 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:808:10)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:808:10)>
             ::_M_manager;
  local_a8._8_8_ =
       std::
       _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:825:10)>
       ::_M_invoke;
  local_a8._0_8_ =
       std::
       _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:825:10)>
       ::_M_manager;
  local_b8._0_8_ = psVal;
  parser::memoize<std::__cxx11::string>
            ((combinator *)&_Stack_138,(parser *)0x3,(ind)psVal,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,in_R8);
  if (local_128 != (code *)0x0) {
    bVar1 = (*local_120)(&_Stack_138,ps);
    if (local_128 != (code *)0x0) {
      (*local_128)(&_Stack_138,&_Stack_138,__destroy_functor);
    }
    if ((code *)local_a8._0_8_ != (code *)0x0) {
      (*(code *)local_a8._0_8_)(local_b8,local_b8,3);
    }
    if (local_c8 != (code *)0x0) {
      (*local_c8)(&local_d8,&local_d8,3);
    }
    if (local_e8 != (code *)0x0) {
      (*local_e8)(&local_f8,&local_f8,3);
    }
    lVar3 = -0x40;
    puVar2 = &local_38;
    do {
      if ((code *)puVar2[2] != (code *)0x0) {
        (*(code *)puVar2[2])(puVar2,puVar2,3);
      }
      puVar2 = puVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,3);
    }
    lVar3 = -0x40;
    puVar2 = &local_78;
    do {
      if ((code *)puVar2[2] != (code *)0x0) {
        (*(code *)puVar2[2])(puVar2,puVar2,3);
      }
      puVar2 = puVar2 + -4;
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 0);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool cmd_str(parser::state& ps, std::string          & psVal) {
		return parser::memoize(3, psVal, parser::capture(psVal, parser::memoize_many(4, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						nl,
						parser::literal('#')})),
				parser::any()}))))(ps);
	}